

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_singleton.c
# Opt level: O3

int log_singleton_destroy(void)

{
  int iVar1;
  int extraout_EAX;
  log_singleton plVar2;
  
  if (log_singleton_instance::s != (log_singleton)0x0) {
    plVar2 = log_singleton_instance_impl();
    log_map_clear(plVar2->map);
    iVar1 = log_map_destroy(log_singleton_instance::s->map);
    if (iVar1 == 0) {
      log_singleton_instance::s->map = (log_map)0x0;
      free(log_singleton_instance::s);
      log_singleton_instance::s = (log_singleton)0x0;
      iVar1 = extraout_EAX;
    }
    return iVar1;
  }
  abort();
}

Assistant:

int log_singleton_destroy(void)
{
	log_singleton *s = log_singleton_instance();

	if (*s == NULL)
	{
		abort();
	}

	log_singleton_clear();

	if (log_map_destroy((*s)->map) != 0)
	{
		return 1;
	}

	(*s)->map = NULL;

	free(*s);

	*s = NULL;

	return 0;
}